

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool can_bash(CHAR_DATA *ch,CHAR_DATA *victim)

{
  ulong uVar1;
  bool bVar2;
  CHAR_DATA *in_RSI;
  long in_RDI;
  __type_conflict2 _Var3;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar2 = is_npc(in_stack_ffffffffffffffd8);
  if (((((bVar2) &&
        (uVar1 = *(ulong *)(in_RDI + 0x2c0), _Var3 = std::pow<int,int>(0,0x5e717b),
        (uVar1 & (long)_Var3) == 0)) || (in_RSI->position < 7)) ||
      (((*(short *)(in_RDI + 0x2a0) + 1 < (int)in_RSI->size ||
        ((int)in_RSI->size < *(short *)(in_RDI + 0x2a0) + -1)) ||
       ((bVar2 = is_affected(in_RSI,(int)gsn_protective_shield), bVar2 ||
        ((bVar2 = is_affected(in_RSI,(int)gsn_sanguine_ward), bVar2 ||
         (bVar2 = is_affected(in_RSI,(int)gsn_heatshield), bVar2)))))))) ||
     ((bVar2 = is_affected(in_RSI,(int)gsn_elecshield), bVar2 ||
      ((((bVar2 = is_affected(in_RSI,(int)gsn_airshield), bVar2 ||
         (bVar2 = is_affected(in_RSI,(int)gsn_earthshield), bVar2)) ||
        (bVar2 = is_affected(in_RSI,(int)gsn_watershield), bVar2)) ||
       (bVar2 = is_affected(in_RSI,(int)gsn_coldshield), bVar2)))))) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool can_bash(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if ((is_npc(ch) && !IS_SET(ch->off_flags, OFF_BASH))
		|| victim->position < POS_FIGHTING
		|| ch->size + 1 < victim->size
		|| ch->size - 1 > victim->size
		|| is_affected(victim, gsn_protective_shield)
		|| is_affected(victim, gsn_sanguine_ward)
		|| is_affected(victim, gsn_heatshield)
		|| is_affected(victim, gsn_elecshield)
		|| is_affected(victim, gsn_airshield)
		|| is_affected(victim, gsn_earthshield)
		|| is_affected(victim, gsn_watershield)
		|| is_affected(victim, gsn_coldshield))
	{
		return false;
	}

	return true;
}